

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O0

bool set_process_priority(ggml_sched_priority prio)

{
  int iVar1;
  common_log *log;
  int *piVar2;
  char *pcVar3;
  uint *puVar4;
  uint in_EDI;
  int p;
  int local_c;
  bool local_1;
  
  if (in_EDI == 0) {
    local_1 = true;
  }
  else {
    local_c = 0;
    switch(in_EDI) {
    case 1:
      local_c = -5;
      break;
    case 2:
      local_c = -10;
      break;
    case 3:
      local_c = -0x14;
    }
    iVar1 = setpriority(PRIO_PROCESS,0,local_c);
    if (iVar1 == 0) {
      if (-1 < common_log_verbosity_thold) {
        log = common_log_main();
        piVar2 = __errno_location();
        pcVar3 = strerror(*piVar2);
        puVar4 = (uint *)__errno_location();
        common_log_add(log,GGML_LOG_LEVEL_WARN,"failed to set process priority %d : %s (%d)\n",
                       (ulong)in_EDI,pcVar3,(ulong)*puVar4);
      }
      local_1 = false;
    }
    else {
      local_1 = true;
    }
  }
  return local_1;
}

Assistant:

bool set_process_priority(enum ggml_sched_priority prio) {
    if (prio == GGML_SCHED_PRIO_NORMAL) {
        return true;
    }

    int p = 0;
    switch (prio) {
        case GGML_SCHED_PRIO_NORMAL:   p =  0;  break;
        case GGML_SCHED_PRIO_MEDIUM:   p = -5;  break;
        case GGML_SCHED_PRIO_HIGH:     p = -10; break;
        case GGML_SCHED_PRIO_REALTIME: p = -20; break;
    }

    if (!setpriority(PRIO_PROCESS, 0, p)) {
        LOG_WRN("failed to set process priority %d : %s (%d)\n", prio, strerror(errno), errno);
        return false;
    }
    return true;
}